

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O2

void __thiscall VanAnalyzer::SetupResults(VanAnalyzer *this)

{
  VanAnalyzerResults *this_00;
  
  this_00 = (VanAnalyzerResults *)operator_new(0x20);
  VanAnalyzerResults::VanAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<VanAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void VanAnalyzer::SetupResults()
{
    mResults.reset( new VanAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}